

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

char * cimg_library::cimg::imagemagick_path(char *user_path,bool reinit_path)

{
  uint uVar1;
  FILE *__stream;
  
  if (imagemagick_path(char_const*,bool)::s_path == '\0') {
    imagemagick_path();
  }
  if (Mutex_attr()::val == '\0') {
    imagemagick_path();
  }
  pthread_mutex_lock((pthread_mutex_t *)(Mutex_attr()::val + 0x118));
  if (reinit_path) {
    if ((imagemagick_path::s_path._is_shared == false) &&
       (imagemagick_path::s_path._data != (char *)0x0)) {
      operator_delete__(imagemagick_path::s_path._data);
    }
    imagemagick_path::s_path._data = (char *)0x0;
    imagemagick_path::s_path._width = 0;
    imagemagick_path::s_path._height = 0;
    imagemagick_path::s_path._depth = 0;
    imagemagick_path::s_path._spectrum = 0;
    imagemagick_path::s_path._is_shared = false;
  }
  if (user_path == (char *)0x0) {
    if (imagemagick_path::s_path._data == (char *)0x0) {
      CImg<char>::assign(&imagemagick_path::s_path,0x400,1,1,1);
      builtin_strncpy(imagemagick_path::s_path._data,"./convert",10);
      __stream = ::fopen(imagemagick_path::s_path._data,"r");
      if (__stream == (FILE *)0x0) {
        builtin_strncpy(imagemagick_path::s_path._data,"convert",8);
      }
      else if ((_stdin != __stream) && (_stdout != __stream)) {
        uVar1 = ::fclose(__stream);
        if (uVar1 != 0) {
          warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar1);
        }
      }
    }
  }
  else {
    if (imagemagick_path::s_path._data == (char *)0x0) {
      CImg<char>::assign(&imagemagick_path::s_path,0x400,1,1,1);
    }
    strncpy(imagemagick_path::s_path._data,user_path,0x3ff);
  }
  if (Mutex_attr()::val == '\0') {
    imagemagick_path();
  }
  pthread_mutex_unlock((pthread_mutex_t *)(Mutex_attr()::val + 0x118));
  return imagemagick_path::s_path._data;
}

Assistant:

inline const char* imagemagick_path(const char *const user_path, const bool reinit_path) {
    static CImg<char> s_path;
    cimg::mutex(7);
    if (reinit_path) s_path.assign();
    if (user_path) {
      if (!s_path) s_path.assign(1024);
      std::strncpy(s_path,user_path,1023);
    } else if (!s_path) {
      s_path.assign(1024);
      bool path_found = false;
      std::FILE *file = 0;
#if cimg_OS==2
      const char *const pf_path = programfiles_path();
      if (!path_found) {
        std::strcpy(s_path,".\\convert.exe");
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=10 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%.2d-\\convert.exe",pf_path,k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 9; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d-Q\\convert.exe",pf_path,k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d\\convert.exe",pf_path,k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=10 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%.2d-\\VISUA~1\\BIN\\convert.exe",pf_path,k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 9; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d-Q\\VISUA~1\\BIN\\convert.exe",pf_path,k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"%s\\IMAGEM~1.%d\\VISUA~1\\BIN\\convert.exe",pf_path,k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=10 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%.2d-\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 9; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d-Q\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=10 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%.2d-\\VISUA~1\\BIN\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 9; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d-Q\\VISUA~1\\BIN\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"C:\\IMAGEM~1.%d\\VISUA~1\\BIN\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=10 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%.2d-\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 9; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d-Q\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=10 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%.2d-\\VISUA~1\\BIN\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 9; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d-Q\\VISUA~1\\BIN\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      for (int k = 32; k>=0 && !path_found; --k) {
        cimg_snprintf(s_path,s_path._width,"D:\\IMAGEM~1.%d\\VISUA~1\\BIN\\convert.exe",k);
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      if (!path_found) std::strcpy(s_path,"convert.exe");
#else
      if (!path_found) {
        std::strcpy(s_path,"./convert");
        if ((file=std::fopen(s_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
      }
      if (!path_found) std::strcpy(s_path,"convert");
#endif
      winformat_string(s_path);
    }
    cimg::mutex(7,0);
    return s_path;
  }